

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int google::protobuf::io::CodedOutputStream::VarintSize32Fallback(uint32 value)

{
  int iVar1;
  
  if (value < 0x80) {
    iVar1 = 1;
  }
  else if (value < 0x4000) {
    iVar1 = 2;
  }
  else {
    if (0x1fffff < value) {
      return 5 - (uint)(value < 0x10000000);
    }
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int CodedOutputStream::VarintSize32Fallback(uint32 value) {
  if (value < (1 << 7)) {
    return 1;
  } else if (value < (1 << 14)) {
    return 2;
  } else if (value < (1 << 21)) {
    return 3;
  } else if (value < (1 << 28)) {
    return 4;
  } else {
    return 5;
  }
}